

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadMaterialLibrary(CoronaLoader *this,FileName *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Ref<embree::XML> *pRVar2;
  int iVar3;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  FileName *in_RDX;
  Ref<embree::XML> *child;
  Ref<embree::XML> *xml_00;
  Ref<embree::XML> xml;
  long *local_98;
  FileName local_90;
  string local_70;
  string local_50;
  
  FileName::operator+(&local_90,fileName,in_RDX);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/.-","");
  parseXML((embree *)&local_98,&local_90,&local_70,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  paVar1 = &local_90.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.filename._M_dataplus._M_p);
  }
  iVar3 = std::__cxx11::string::compare((char *)(local_98 + 6));
  if (iVar3 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(local_98 + 2));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90.filename._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_90.filename._M_dataplus._M_p == psVar5) {
      local_90.filename.field_2._M_allocated_capacity = *psVar5;
      local_90.filename.field_2._8_8_ = plVar4[3];
      local_90.filename._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.filename.field_2._M_allocated_capacity = *psVar5;
    }
    local_90.filename._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_90);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  xml_00 = (Ref<embree::XML> *)local_98[0x10];
  pRVar2 = (Ref<embree::XML> *)local_98[0x11];
  if (xml_00 == pRVar2) {
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    do {
      iVar3 = std::__cxx11::string::compare((char *)&xml_00->ptr->name);
      if (iVar3 == 0) {
        loadMaterialDefinition((CoronaLoader *)fileName,xml_00);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&xml_00->ptr->name);
        if (iVar3 == 0) {
          loadMapDefinition((CoronaLoader *)fileName,xml_00);
        }
      }
      xml_00 = xml_00 + 1;
    } while (xml_00 != pRVar2);
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
    if (local_98 == (long *)0x0) {
      return (Ref<embree::SceneGraph::Node>)(Node *)this;
    }
  }
  (**(code **)(*local_98 + 0x18))();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadMaterialLibrary(const FileName& fileName) 
  {
    Ref<XML> xml = parseXML(path+fileName,"/.-",false);
    if (xml->name != "mtlLib") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material library");
    
    for (auto& child : xml->children)
    {
      if (child->name == "materialDefinition") {
        loadMaterialDefinition(child);
      }
      else if (child->name == "mapDefinition")
        loadMapDefinition(child);
    }

    return nullptr;
  }